

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_bset_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)wt * 0x10;
  lVar2 = (ulong)ws * 0x10;
  *(byte *)((env->active_fpu).fpr + wd) =
       '\x01' << (*(byte *)((env->active_fpu).fpr + wt) & 7) | *(byte *)((env->active_fpu).fpr + ws)
  ;
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 1) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 1) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 1);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 2) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 2) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 2);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 3) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 3) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 3);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 4) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 4) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 4);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 5) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 5) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 5);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 6) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 6) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 6);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 7) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 7) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 7);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 8) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 8) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 8);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 9) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 9) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 9);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 10) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 10) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 10);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xb) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xb) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xb);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xc) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xc) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xc);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xd) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xd) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xd);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xe) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xe) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xe);
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xf) =
       '\x01' << (*(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xf) & 7) |
       *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xf);
  return;
}

Assistant:

void helper_msa_bset_b(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_bset_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_bset_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_bset_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_bset_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_bset_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_bset_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_bset_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_bset_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_bset_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_bset_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_bset_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_bset_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_bset_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_bset_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_bset_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_bset_df(DF_BYTE, pws->b[15], pwt->b[15]);
}